

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

StructDefinition * __thiscall adios2::core::IO::DefineStruct(IO *this,string *name,size_t size)

{
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
  *this_00;
  pointer ppVar1;
  size_t in_RSI;
  long *in_RDI;
  StructDefinition *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  StructDefinition *this_01;
  StructDefinition *in_stack_ffffffffffffff80;
  string local_68 [2];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_true>
  local_20;
  
  this_00 = (unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
             *)(*in_RDI + 0x20);
  StructDefinition::StructDefinition(in_stack_ffffffffffffff80,local_68,in_RSI);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_multimap<std::__cxx11::string,adios2::core::StructDefinition,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,adios2::core::StructDefinition>>>
       ::emplace<std::__cxx11::string_const&,adios2::core::StructDefinition>
                 (this_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  ppVar1 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_false,_true>
                         *)0x8a174c);
  this_01 = &ppVar1->second;
  StructDefinition::~StructDefinition(this_01);
  return this_01;
}

Assistant:

StructDefinition &IO::DefineStruct(const std::string &name, const size_t size)
{
    return m_ADIOS.m_StructDefinitions.emplace(name, StructDefinition(name, size))->second;
}